

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O0

type_conflict4 *
chaiscript::parse_num<long_double>(type_conflict4 *__return_storage_ptr__,string_view t_str)

{
  float fVar1;
  const_iterator pvVar2;
  type_conflict4 *extraout_RAX;
  double __x;
  double in_XMM1_Qa;
  value_type c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  int exponent;
  longdouble decimal_place;
  longdouble base;
  longdouble t;
  string_view t_str_local;
  
  t_str_local._M_len = t_str._M_len;
  fVar1 = 0.0;
  __range2._4_4_ = 0;
  unique0x10000118 = __return_storage_ptr__;
  __end2 = Catch::clara::std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)((long)&t + 8));
  pvVar2 = Catch::clara::std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)((long)&t + 8));
  for (; __end2 != pvVar2; __end2 = __end2 + 1) {
    switch(*__end2) {
    case '+':
      break;
    default:
      break;
    case '-':
      __range2._4_4_ = -1;
      break;
    case '.':
      fVar1 = 10.0;
      break;
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      if (10.0 <= fVar1) {
        fVar1 = fVar1 * 10.0;
      }
      break;
    case 'E':
    case 'e':
      __range2._4_4_ = 1;
      fVar1 = 0.0;
    }
  }
  if (__range2._4_4_ != 0) {
    Catch::clara::std::pow(__x,in_XMM1_Qa);
    __end2 = (const_iterator)extraout_RAX;
  }
  return (type_conflict4 *)__end2;
}

Assistant:

[[nodiscard]] auto parse_num(const std::string_view t_str) -> typename std::enable_if<!std::is_integral<T>::value, T>::type {
    T t = 0;
    T base{};
    T decimal_place = 0;
    int exponent = 0;

    for (const auto c : t_str) {
      switch (c) {
        case '.':
          decimal_place = 10;
          break;
        case 'e':
        case 'E':
          exponent = 1;
          decimal_place = 0;
          base = t;
          t = 0;
          break;
        case '-':
          exponent = -1;
          break;
        case '+':
          break;
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
          if (decimal_place < 10) {
            t *= 10;
            t += static_cast<T>(c - '0');
          } else {
            t += static_cast<T>(c - '0') / decimal_place;
            decimal_place *= 10;
          }
          break;
        default:
          break;
      }
    }
    return exponent ? base * std::pow(T(10), t * static_cast<T>(exponent)) : t;
  }